

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
metal::scatter(metal *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  vec3 *pvVar1;
  double dVar2;
  ray local_d8;
  vec3 local_a8;
  vec3 local_90;
  vec3 local_78;
  vec3 local_60;
  undefined1 local_48 [8];
  vec3 reflected;
  ray *scattered_local;
  color *attenuation_local;
  hit_record *rec_local;
  ray *r_in_local;
  metal *this_local;
  
  reflected.e[2] = (double)scattered;
  pvVar1 = ray::direction(r_in);
  reflect((vec3 *)local_48,pvVar1,&rec->normal);
  unit_vector(&local_78,(vec3 *)local_48);
  dVar2 = this->fuzz;
  random_unit_vector();
  operator*(&local_90,dVar2,&local_a8);
  operator+(&local_60,&local_78,&local_90);
  local_48 = (undefined1  [8])local_60.e[0];
  reflected.e[0] = local_60.e[1];
  reflected.e[1] = local_60.e[2];
  ray::ray(&local_d8,&rec->p,(vec3 *)local_48);
  memcpy((void *)reflected.e[2],&local_d8,0x30);
  attenuation->e[0] = (this->albedo).e[0];
  attenuation->e[1] = (this->albedo).e[1];
  attenuation->e[2] = (this->albedo).e[2];
  pvVar1 = ray::direction((ray *)reflected.e[2]);
  dVar2 = dot(pvVar1,&rec->normal);
  return 0.0 < dVar2;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        vec3 reflected = reflect(r_in.direction(), rec.normal);
        reflected = unit_vector(reflected) + (fuzz * random_unit_vector());
        scattered = ray(rec.p, reflected);
        attenuation = albedo;
        return (dot(scattered.direction(), rec.normal) > 0);
    }